

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tree_schema.c
# Opt level: O1

lys_node *
lys_node_dup(lys_module *module,lys_node *parent,lys_node *node,unres_schema *unres,int shallow)

{
  LYS_NODE LVar1;
  int iVar2;
  lys_node *plVar3;
  lys_node *plVar4;
  lys_node *plVar5;
  lys_node *plVar6;
  lys_node *plVar7;
  
  iVar2 = 0;
  if ((shallow == 0) && (iVar2 = 1, plVar5 = parent, parent != (lys_node *)0x0)) {
    do {
      LVar1 = plVar5->nodetype;
      if ((LVar1 & (LYS_ACTION|LYS_GROUPING|LYS_OUTPUT|LYS_INPUT|LYS_RPC|LYS_NOTIF)) != LYS_UNKNOWN)
      {
        iVar2 = (uint)(LVar1 != LYS_GROUPING) * 2;
        break;
      }
      if (LVar1 == LYS_EXT) {
        if (plVar5->padding[1] != '\x01') goto LAB_00162128;
        plVar5 = (lys_node *)plVar5->dsc;
LAB_00162119:
        if (plVar5->nodetype == LYS_AUGMENT) {
          plVar5 = plVar5->prev;
        }
      }
      else {
        plVar5 = plVar5->parent;
        if (plVar5 != (lys_node *)0x0) goto LAB_00162119;
LAB_00162128:
        plVar5 = (lys_node *)0x0;
      }
    } while (plVar5 != (lys_node *)0x0);
  }
  plVar3 = lys_node_dup_recursion(module,parent,node,unres,shallow,iVar2);
  plVar5 = plVar3;
  if (plVar3 != (lys_node *)0x0 && iVar2 != 0) {
    do {
      iVar2 = lys_has_xpath(plVar5);
      if ((iVar2 != 0) &&
         (iVar2 = unres_schema_add_node(module,unres,plVar5,UNRES_XPATH,(lys_node *)0x0),
         iVar2 == -1)) {
        return (lys_node *)0x0;
      }
      if ((plVar5->nodetype & 0x882c) == LYS_UNKNOWN) {
        plVar4 = plVar5->child;
      }
      else {
        plVar4 = (lys_node *)0x0;
      }
      if (plVar4 == (lys_node *)0x0) {
        if (plVar5 == plVar3) {
          return plVar3;
        }
        plVar4 = plVar5->next;
      }
      if (plVar4 == (lys_node *)0x0) {
        do {
          if (plVar5 == (lys_node *)0x0) {
LAB_00162044:
            plVar5 = (lys_node *)0x0;
          }
          else {
            if (plVar5->nodetype == LYS_EXT) {
              if (plVar5->padding[1] != '\x01') goto LAB_00162044;
              plVar5 = (lys_node *)plVar5->dsc;
            }
            else {
              plVar5 = plVar5->parent;
              if (plVar5 == (lys_node *)0x0) goto LAB_00162044;
            }
            if (plVar5->nodetype == LYS_AUGMENT) {
              plVar5 = plVar5->prev;
            }
          }
          if (plVar5 == (lys_node *)0x0) {
LAB_0016207b:
            plVar6 = (lys_node *)0x0;
          }
          else {
            if (plVar5->nodetype == LYS_EXT) {
              if (plVar5->padding[1] != '\x01') goto LAB_0016207b;
              plVar6 = (lys_node *)plVar5->dsc;
            }
            else {
              plVar6 = plVar5->parent;
              if (plVar6 == (lys_node *)0x0) goto LAB_0016207b;
            }
            if (plVar6->nodetype == LYS_AUGMENT) {
              plVar6 = plVar6->prev;
            }
          }
          if (plVar3->nodetype == LYS_EXT) {
            if (plVar3->padding[1] != '\x01') goto LAB_001620aa;
            plVar7 = (lys_node *)plVar3->dsc;
LAB_0016209b:
            if (plVar7->nodetype == LYS_AUGMENT) {
              plVar7 = plVar7->prev;
            }
          }
          else {
            plVar7 = plVar3->parent;
            if (plVar7 != (lys_node *)0x0) goto LAB_0016209b;
LAB_001620aa:
            plVar7 = (lys_node *)0x0;
          }
        } while ((plVar6 != plVar7) && (plVar4 = plVar5->next, plVar4 == (lys_node *)0x0));
      }
      plVar5 = plVar4;
    } while (plVar4 != (lys_node *)0x0);
  }
  return plVar3;
}

Assistant:

struct lys_node *
lys_node_dup(struct lys_module *module, struct lys_node *parent, const struct lys_node *node,
             struct unres_schema *unres, int shallow)
{
    struct lys_node *p = NULL;
    int finalize = 0;
    struct lys_node *result, *iter, *next;

    if (!shallow) {
        /* get know where in schema tree we are to know what should be done during instantiation of the grouping */
        for (p = parent;
             p && !(p->nodetype & (LYS_NOTIF | LYS_INPUT | LYS_OUTPUT | LYS_RPC | LYS_ACTION | LYS_GROUPING));
             p = lys_parent(p));
        finalize = p ? ((p->nodetype == LYS_GROUPING) ? 0 : 2) : 1;
    }

    result = lys_node_dup_recursion(module, parent, node, unres, shallow, finalize);
    if (finalize) {
        /* check xpath expressions in the instantiated tree */
        for (iter = next = result; iter; iter = next) {
            if (lys_has_xpath(iter) && unres_schema_add_node(module, unres, iter, UNRES_XPATH, NULL) == -1) {
                /* invalid xpath */
                return NULL;
            }

            /* select next item */
            if (iter->nodetype & (LYS_LEAF | LYS_LEAFLIST | LYS_ANYDATA | LYS_GROUPING)) {
                /* child exception for leafs, leaflists and anyxml without children, ignore groupings */
                next = NULL;
            } else {
                next = iter->child;
            }
            if (!next) {
                /* no children, try siblings */
                if (iter == result) {
                    /* we are done, no next element to process */
                    break;
                }
                next = iter->next;
            }
            while (!next) {
                /* parent is already processed, go to its sibling */
                iter = lys_parent(iter);
                if (lys_parent(iter) == lys_parent(result)) {
                    /* we are done, no next element to process */
                    break;
                }
                next = iter->next;
            }
        }
    }

    return result;
}